

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect6-error.c
# Opt level: O1

int run_test_tcp_connect6_link_local(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  short *psVar3;
  long lVar4;
  uv_handle_t *handle;
  bool bVar5;
  int64_t eval_b_2;
  int64_t eval_b_3;
  int n;
  uv_interface_address_t *ifs;
  uv_connect_t req;
  sockaddr_in6 addr;
  uv_tcp_t server;
  undefined1 local_190 [140];
  sockaddr_in6 local_104;
  uv_tcp_t local_e8;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    run_test_tcp_connect6_link_local_cold_8();
  }
  else {
    iVar1 = uv_interface_addresses
                      ((uv_interface_address_t **)(local_190 + 0x18),(int *)(local_190 + 0x14));
    local_e8.data = (void *)(long)iVar1;
    local_190._32_8_ = (uv__queue *)0x0;
    if (local_e8.data != (void *)0x0) {
      run_test_tcp_connect6_link_local_cold_1();
LAB_001c7dce:
      run_test_tcp_connect6_link_local_cold_3();
LAB_001c7de0:
      run_test_tcp_connect6_link_local_cold_4();
LAB_001c7def:
      run_test_tcp_connect6_link_local_cold_5();
LAB_001c7dfe:
      run_test_tcp_connect6_link_local_cold_6();
LAB_001c7e0d:
      handle = (uv_handle_t *)local_190;
      run_test_tcp_connect6_link_local_cold_7();
      iVar1 = uv_is_closing(handle);
      if (iVar1 == 0) {
        uv_close(handle,(uv_close_cb)0x0);
        return extraout_EAX;
      }
      return iVar1;
    }
    lVar4 = (long)(int)local_190._20_4_;
    bVar5 = 0 < lVar4;
    if (0 < lVar4) {
      psVar3 = (short *)((long)(local_190._24_8_ + 0x14) + 8);
      do {
        if ((psVar3[-4] == 10) && (*psVar3 == -0x7f02)) {
          uv_free_interface_addresses((uv_interface_address_t *)local_190._24_8_,local_190._20_4_);
          if (!bVar5) goto LAB_001c7d9e;
          iVar1 = uv_ip6_addr("fe80::0bad:babe",0x539,&local_104);
          local_e8.data = (void *)(long)iVar1;
          local_190._32_8_ = (uv__queue *)0x0;
          if (local_e8.data != (void *)0x0) goto LAB_001c7dce;
          puVar2 = uv_default_loop();
          iVar1 = uv_tcp_init(puVar2,&local_e8);
          local_190._32_8_ = SEXT48(iVar1);
          local_190._0_8_ = (uv_loop_t *)0x0;
          if ((uv__queue *)local_190._32_8_ != (uv__queue *)0x0) goto LAB_001c7de0;
          iVar1 = uv_tcp_connect((uv_connect_t *)(local_190 + 0x20),&local_e8,(sockaddr *)&local_104
                                 ,connect_cb);
          local_190._0_8_ = SEXT48(iVar1);
          local_190._8_8_ = (uv_loop_t *)0x0;
          if ((uv_loop_t *)local_190._0_8_ != (uv_loop_t *)0x0) goto LAB_001c7def;
          uv_close((uv_handle_t *)&local_e8,(uv_close_cb)0x0);
          puVar2 = uv_default_loop();
          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
          local_190._0_8_ = SEXT48(iVar1);
          local_190._8_8_ = (uv_loop_t *)0x0;
          if ((uv_loop_t *)local_190._0_8_ != (uv_loop_t *)0x0) goto LAB_001c7dfe;
          puVar2 = uv_default_loop();
          uv_walk(puVar2,close_walk_cb,(void *)0x0);
          uv_run(puVar2,UV_RUN_DEFAULT);
          local_190._0_8_ = (uv_loop_t *)0x0;
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          local_190._8_8_ = SEXT48(iVar1);
          if (local_190._0_8_ == local_190._8_8_) {
            uv_library_shutdown();
            return 0;
          }
          goto LAB_001c7e0d;
        }
        bVar5 = (uv_interface_address_t *)(psVar3 + 0x22) <
                (uv_interface_address_t *)(local_190._24_8_ + lVar4 * 0x60);
        psVar3 = psVar3 + 0x30;
      } while (bVar5);
    }
    uv_free_interface_addresses((uv_interface_address_t *)local_190._24_8_,local_190._20_4_);
LAB_001c7d9e:
    run_test_tcp_connect6_link_local_cold_2();
  }
  return 7;
}

Assistant:

TEST_IMPL(tcp_connect6_link_local) {
  uv_interface_address_t* ifs;
  uv_interface_address_t* p;
  struct sockaddr_in6 addr;
  uv_connect_t req;
  uv_tcp_t server;
  int ok;
  int n;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

#if defined(__QEMU__)
  /* qemu's sockaddr_in6 translation is broken pre-qemu 8.0.0
   * when host endianness != guest endiannes.
   * Fixed in https://github.com/qemu/qemu/commit/44cf6731d6b.
   */
  RETURN_SKIP("Test does not currently work in QEMU");
#endif  /* defined(__QEMU__) */

  /* Check there's an interface that routes link-local (fe80::/10) traffic. */
  ASSERT_OK(uv_interface_addresses(&ifs, &n));
  for (p = ifs; p < &ifs[n]; p++)
    if (p->address.address6.sin6_family == AF_INET6)
      if (!memcmp(&p->address.address6.sin6_addr, "\xfe\x80", 2))
        break;
  ok = (p < &ifs[n]);
  uv_free_interface_addresses(ifs, n);

  if (!ok)
    RETURN_SKIP("IPv6 link-local traffic not supported");

  ASSERT_OK(uv_ip6_addr("fe80::0bad:babe", 1337, &addr));
  ASSERT_OK(uv_tcp_init(uv_default_loop(), &server));

  /* We're making two shaky assumptions here:
   * 1. There is a network interface that routes IPv6 link-local traffic, and
   * 2. There is no firewall rule that blackholes or otherwise hard-kills the
   *    connection attempt to the address above, i.e., we don't expect the
   *    connect() system call to fail synchronously.
   */
  ASSERT_OK(uv_tcp_connect(&req,
                           &server,
                           (struct sockaddr*) &addr,
                           connect_cb));

  uv_close((uv_handle_t*) &server, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}